

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall ImGuiMenuColumns::Update(ImGuiMenuColumns *this,int count,float spacing,bool clear)

{
  int i;
  long lVar1;
  float fVar2;
  
  if (count == 3) {
    this->Width = 0.0;
    this->NextWidth = 0.0;
    this->Spacing = spacing;
    if (clear) {
      this->NextWidths[2] = 0.0;
      this->NextWidths[0] = 0.0;
      this->NextWidths[1] = 0.0;
    }
    fVar2 = this->Width;
    lVar1 = 0;
    do {
      if ((lVar1 != 0) && (0.0 < this->NextWidths[lVar1])) {
        fVar2 = fVar2 + spacing;
      }
      this->Pos[lVar1] = (float)(int)fVar2;
      fVar2 = fVar2 + this->NextWidths[lVar1];
      this->NextWidths[lVar1] = 0.0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    this->Width = fVar2;
    return;
  }
  __assert_fail("count == ((int)(sizeof(Pos)/sizeof(*Pos)))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                ,0x1736,"void ImGuiMenuColumns::Update(int, float, bool)");
}

Assistant:

void ImGuiMenuColumns::Update(int count, float spacing, bool clear)
{
    IM_ASSERT(count == IM_ARRAYSIZE(Pos));
    IM_UNUSED(count);
    Width = NextWidth = 0.0f;
    Spacing = spacing;
    if (clear)
        memset(NextWidths, 0, sizeof(NextWidths));
    for (int i = 0; i < IM_ARRAYSIZE(Pos); i++)
    {
        if (i > 0 && NextWidths[i] > 0.0f)
            Width += Spacing;
        Pos[i] = (float)(int)Width;
        Width += NextWidths[i];
        NextWidths[i] = 0.0f;
    }
}